

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::SimdLaneOpExpr,_std::default_delete<wabt::SimdLaneOpExpr>_> __thiscall
wabt::MakeUnique<wabt::SimdLaneOpExpr,wabt::Opcode&,unsigned_long&>
          (wabt *this,Opcode *args,unsigned_long *args_1)

{
  Enum EVar1;
  unsigned_long uVar2;
  undefined8 *puVar3;
  
  puVar3 = (undefined8 *)operator_new(0x48);
  EVar1 = args->enum_;
  uVar2 = *args_1;
  *(undefined8 *)((long)puVar3 + 0x24) = 0;
  *(undefined8 *)((long)puVar3 + 0x2c) = 0;
  puVar3[3] = 0;
  puVar3[4] = 0;
  puVar3[1] = 0;
  puVar3[2] = 0;
  *(undefined4 *)(puVar3 + 7) = 0x29;
  *puVar3 = &PTR__Expr_002e56f0;
  *(Enum *)((long)puVar3 + 0x3c) = EVar1;
  puVar3[8] = uVar2;
  *(undefined8 **)this = puVar3;
  return (__uniq_ptr_data<wabt::SimdLaneOpExpr,_std::default_delete<wabt::SimdLaneOpExpr>,_true,_true>
          )(__uniq_ptr_data<wabt::SimdLaneOpExpr,_std::default_delete<wabt::SimdLaneOpExpr>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}